

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O3

void __thiscall
amrex::EB2::Level::fillAreaFrac(Level *this,Array<MultiCutFab_*,_3> *a_areafrac,Geometry *geom)

{
  int *piVar1;
  undefined8 uVar2;
  MultiCutFab *dstmf;
  element_type *peVar3;
  pointer ppVar4;
  pointer pIVar5;
  bool bVar6;
  int i;
  CutFab *pCVar7;
  BaseFab<double> *this_00;
  FabArray<amrex::FArrayBox> *src;
  int idim_1;
  int idim;
  long lVar8;
  pointer pIVar9;
  pointer ppVar10;
  int iVar11;
  int iVar12;
  Box r;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_2b0;
  Box bx;
  double local_278;
  undefined1 local_270 [24];
  pointer local_258;
  pointer pbStack_250;
  Array4<double> local_230;
  Array4<double> local_1f0;
  MultiFab tmp;
  
  if (this->m_allregular == true) {
    lVar8 = 0;
    do {
      MultiCutFab::setVal(a_areafrac->_M_elems[lVar8],1.0);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
  }
  else {
    src = (FabArray<amrex::FArrayBox> *)&this->m_areafrac;
    lVar8 = 0;
    do {
      dstmf = a_areafrac->_M_elems[lVar8];
      local_270._0_8_ = (double *)0x1;
      local_258 = (pointer)0x0;
      pbStack_250 = (pointer)0x0;
      local_270._8_8_ = (Arena *)0x0;
      local_270._16_8_ = (pointer)0x0;
      local_230.p = (double *)&PTR__FabFactory_00712918;
      MultiFab::MultiFab((MultiFab *)&tmp.super_FabArray<amrex::FArrayBox>,
                         &(dstmf->m_data).super_FabArrayBase.boxarray,
                         &(dstmf->m_data).super_FabArrayBase.distributionMap,
                         (dstmf->m_data).super_FabArrayBase.n_comp,
                         (dstmf->m_data).super_FabArrayBase.n_grow.vect[0],(MFInfo *)local_270,
                         (FabFactory<amrex::FArrayBox> *)&local_230);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_270 + 0x10));
      FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (&tmp.super_FabArray<amrex::FArrayBox>,1.0,0,
                 tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp,
                 &tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow);
      iVar11 = (dstmf->m_data).super_FabArrayBase.n_grow.vect[0];
      iVar12 = (dstmf->m_data).super_FabArrayBase.n_comp;
      local_1f0._0_12_ = Geometry::periodicity(geom);
      local_270._0_8_ = (double *)0x0;
      local_270._8_8_ = local_270._8_8_ & 0xffffffff00000000;
      local_230.p = (double *)CONCAT44(iVar11,iVar11);
      local_230.jstride._0_4_ = iVar11;
      FabArray<amrex::FArrayBox>::ParallelCopy_nowait
                (&tmp.super_FabArray<amrex::FArrayBox>,src,0,0,iVar12,(IntVect *)local_270,
                 (IntVect *)&local_230,(Periodicity *)&local_1f0,COPY,(CPC *)0x0,false);
      anon_unknown_2::copyMultiFabToMultiCutFab
                (dstmf,(MultiFab *)&tmp.super_FabArray<amrex::FArrayBox>);
      MultiFab::~MultiFab((MultiFab *)&tmp.super_FabArray<amrex::FArrayBox>);
      lVar8 = lVar8 + 1;
      src = src + 1;
    } while (lVar8 != 3);
    tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._0_12_ = Geometry::periodicity(geom);
    Periodicity::shiftIntVect(&local_2b0,(Periodicity *)&tmp);
    peVar3 = (this->m_covered_grids).m_ref.
             super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        *(pointer *)
         ((long)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data + 8)) {
      isects.
      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      isects.
      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      isects.
      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      MFIter::MFIter((MFIter *)&tmp,(FabArrayBase *)a_areafrac->_M_elems[0],'\0');
      if (tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
          m_loshft.vect[0] <
          tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
          m_loshft.vect[2]) {
        do {
          bVar6 = MultiCutFab::ok(a_areafrac->_M_elems[0],(MFIter *)&tmp);
          if (bVar6) {
            pCVar7 = MultiCutFab::operator[](a_areafrac->_M_elems[0],(MFIter *)&tmp);
            bx.smallend.vect._0_8_ =
                 *(undefined8 *)(pCVar7->super_FArrayBox).super_BaseFab<double>.domain.smallend.vect
            ;
            uVar2 = *(undefined8 *)
                     (pCVar7->super_FArrayBox).super_BaseFab<double>.domain.bigend.vect;
            bx.smallend.vect[2] =
                 (int)*(undefined8 *)
                       ((pCVar7->super_FArrayBox).super_BaseFab<double>.domain.smallend.vect + 2);
            bx.bigend.vect[0] = (int)uVar2;
            bx.bigend.vect[1] = (int)((ulong)uVar2 >> 0x20);
            bx._20_8_ = *(undefined8 *)
                         ((pCVar7->super_FArrayBox).super_BaseFab<double>.domain.bigend.vect + 2);
            lVar8 = 0;
            do {
              if ((bx.btype.itype >> ((uint)lVar8 & 0x1f) & 1) != 0) {
                piVar1 = bx.bigend.vect + lVar8;
                *piVar1 = *piVar1 + -1;
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 != 3);
            bx._20_8_ = bx._20_8_ & 0xffffffff;
            MultiCutFab::array((Array4<double> *)local_270,a_areafrac->_M_elems[0],(MFIter *)&tmp);
            MultiCutFab::array(&local_230,a_areafrac->_M_elems[1],(MFIter *)&tmp);
            MultiCutFab::array(&local_1f0,a_areafrac->_M_elems[2],(MFIter *)&tmp);
            pIVar5 = local_2b0.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            for (pIVar9 = local_2b0.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start; pIVar9 != pIVar5;
                pIVar9 = pIVar9 + 1) {
              r.bigend.vect[2] = bx.bigend.vect[2];
              r.btype.itype = bx.btype.itype;
              r.smallend.vect[0] = bx.smallend.vect[0] + (int)*(undefined8 *)pIVar9->vect;
              r.smallend.vect[1] =
                   bx.smallend.vect[1] + (int)((ulong)*(undefined8 *)pIVar9->vect >> 0x20);
              r.smallend.vect[2] = bx.smallend.vect[2] + pIVar9->vect[2];
              r.bigend.vect[0] = bx.bigend.vect[0] + pIVar9->vect[0];
              r.bigend.vect[1] = bx.bigend.vect[1] + pIVar9->vect[1];
              r.bigend.vect[2] = r.bigend.vect[2] + pIVar9->vect[2];
              BoxArray::intersections(&this->m_covered_grids,&r,&isects);
              ppVar4 = isects.
                       super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (ppVar10 = isects.
                             super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; ppVar10 != ppVar4;
                  ppVar10 = ppVar10 + 1) {
                lVar8 = 0;
                do {
                  r.btype.itype = (ppVar10->second).btype.itype;
                  uVar2 = *(undefined8 *)((ppVar10->second).bigend.vect + 1);
                  iVar11 = (int)*(undefined8 *)(pIVar9->vect + 1);
                  iVar12 = (int)((ulong)*(undefined8 *)(pIVar9->vect + 1) >> 0x20);
                  r.smallend.vect[2] = (ppVar10->second).smallend.vect[2] - iVar12;
                  r.smallend.vect[1] = (ppVar10->second).smallend.vect[1] - iVar11;
                  r.smallend.vect[0] = (ppVar10->second).smallend.vect[0] - pIVar9->vect[0];
                  r.bigend.vect[0] = (ppVar10->second).bigend.vect[0] - pIVar9->vect[0];
                  r.bigend.vect[1] = (int)uVar2 - iVar11;
                  r.bigend.vect[2] = (int)((ulong)uVar2 >> 0x20) - iVar12;
                  if ((r.btype.itype >> ((uint)lVar8 & 0x1f) & 1) == 0) {
                    piVar1 = r.bigend.vect + lVar8;
                    *piVar1 = *piVar1 + 1;
                    r.btype.itype = r.btype.itype | 1 << ((byte)lVar8 & 0x1f);
                  }
                  this_00 = (BaseFab<double> *)
                            MultiCutFab::operator[](a_areafrac->_M_elems[lVar8],(MFIter *)&tmp);
                  local_278 = 0.0;
                  BaseFab<double>::setVal<(amrex::RunOn)1>
                            (this_00,&local_278,&r,(DestComp)0x0,(NumComps)0x1);
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 3);
              }
            }
          }
          MFIter::operator++((MFIter *)&tmp);
        } while (tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                 m_bndryReg.m_loshft.vect[0] <
                 tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                 m_bndryReg.m_loshft.vect[2]);
      }
      MFIter::~MFIter((MFIter *)&tmp);
      if (isects.
          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(isects.
                        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)isects.
                              super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)isects.
                              super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    if (local_2b0.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2b0.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_2b0.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2b0.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void
Level::fillAreaFrac (Array<MultiCutFab*,AMREX_SPACEDIM> const& a_areafrac, const Geometry& geom) const
{
    if (isAllRegular()) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            a_areafrac[idim]->setVal(1.0);
        }
        return;
    }

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
    {
        MultiCutFab& areafrac = *a_areafrac[idim];
        MultiFab tmp(areafrac.boxArray(), areafrac.DistributionMap(),
                     areafrac.nComp(), areafrac.nGrow());
        tmp.setVal(1.0);
        tmp.ParallelCopy(m_areafrac[idim],0,0,areafrac.nComp(),
                         0,areafrac.nGrow(),geom.periodicity());
        copyMultiFabToMultiCutFab(areafrac, tmp);
    }

    const std::vector<IntVect>& pshifts = geom.periodicity().shiftIntVect();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    if (!m_covered_grids.empty())
    {
        std::vector<std::pair<int,Box> > isects;
        for (MFIter mfi(a_areafrac[0]->data()); mfi.isValid(); ++mfi)
        {
            if (a_areafrac[0]->ok(mfi))
            {
                const Box& ccbx = amrex::enclosedCells((*a_areafrac[0])[mfi].box());
                AMREX_D_TERM(auto const& apx = a_areafrac[0]->array(mfi);,
                             auto const& apy = a_areafrac[1]->array(mfi);,
                             auto const& apz = a_areafrac[2]->array(mfi););
                for (const auto& iv : pshifts)
                {
                    m_covered_grids.intersections(ccbx+iv, isects);
                    for (const auto& is : isects) {
                        if (Gpu::inLaunchRegion()) {
                            const Box& bx = is.second-iv;
                            AMREX_D_TERM(const Box& xbx = amrex::surroundingNodes(bx,0);,
                                         const Box& ybx = amrex::surroundingNodes(bx,1);,
                                         const Box& zbx = amrex::surroundingNodes(bx,2););
                            amrex::ParallelFor(AMREX_D_DECL(xbx,ybx,zbx),
                              [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                              {
                                  apx(i,j,k) = 0.0;
                              }
#if (AMREX_SPACEDIM >= 2)
                            , [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                              {
                                  apy(i,j,k) = 0.0;
                              }
#if (AMREX_SPACEDIM == 3)
                            , [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                              {
                                  apz(i,j,k) = 0.0;
                              }
#endif
#endif
                            );
                        } else {
                            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                                const Box& fbx = amrex::surroundingNodes(is.second-iv,idim);
                                (*a_areafrac[idim])[mfi].setVal<RunOn::Host>(0.0, fbx, 0, 1);
                            }
                        }
                    }
                }
            }
        }
    }
}